

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall cfd::core::Psbt::SetTxOutData(Psbt *this,uint32_t index,KeyData *key)

{
  pointer *this_00;
  void *pvVar1;
  bool bVar2;
  CfdException *this_01;
  Script local_300;
  Script local_2c8;
  undefined1 local_28a;
  allocator local_289;
  string local_288;
  CfdSourceLocation local_268;
  Script local_250;
  undefined1 local_218 [8];
  Script wpkh_script;
  Script local_1a8;
  undefined1 local_170 [8];
  Script script;
  Script redeem_script;
  undefined1 local_e8 [8];
  Script locking_script;
  wally_tx_output *txout;
  Pubkey local_a0;
  reference local_88;
  KeyData *item;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__range2;
  undefined1 local_58 [8];
  Pubkey pubkey;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> arr;
  wally_psbt *psbt_pointer;
  KeyData *key_local;
  uint32_t index_local;
  Psbt *this_local;
  
  (*this->_vptr_Psbt[3])(this,(ulong)index,0xb61,"SetTxOutData");
  pvVar1 = this->wally_psbt_pointer_;
  GetTxOutKeyDataList((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                      &pubkey.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,this,index);
  KeyData::GetPubkey((Pubkey *)local_58,key);
  this_00 = &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2 = ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::begin
                     ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)this_00);
  item = (KeyData *)
         ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::end
                   ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
                                     *)&item), bVar2) {
    local_88 = __gnu_cxx::
               __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
               ::operator*(&__end2);
    KeyData::GetPubkey(&local_a0,local_88);
    bVar2 = Pubkey::Equals((Pubkey *)local_58,&local_a0);
    Pubkey::~Pubkey(&local_a0);
    if (bVar2) goto LAB_002ed687;
    __gnu_cxx::
    __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
    ::operator++(&__end2);
  }
  locking_script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(*(long *)(*(long *)((long)pvVar1 + 8) + 0x20) + (ulong)index * 0x70);
  ByteData::ByteData((ByteData *)
                     &redeem_script.script_stack_.
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     *(uint8_t **)
                      &(locking_script.script_stack_.
                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->type_,
                     *(uint32_t *)
                      &((locking_script.script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->op_code_).
                       _vptr_ScriptOperator);
  Script::Script((Script *)local_e8,
                 (ByteData *)
                 &redeem_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)
                      &redeem_script.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Script::Script((Script *)
                 &script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Script::Script((Script *)local_170);
  bVar2 = Script::IsP2pkhScript((Script *)local_e8);
  if (bVar2) {
    ScriptUtil::CreateP2pkhLockingScript(&local_1a8,(Pubkey *)local_58);
    Script::operator=((Script *)local_170,&local_1a8);
    Script::~Script(&local_1a8);
  }
  else {
    bVar2 = Script::IsP2wpkhScript((Script *)local_e8);
    if (bVar2) {
      ScriptUtil::CreateP2wpkhLockingScript
                ((Script *)
                 &wpkh_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(Pubkey *)local_58);
      Script::operator=((Script *)local_170,
                        (Script *)
                        &wpkh_script.script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Script::~Script((Script *)
                      &wpkh_script.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      bVar2 = Script::IsP2shScript((Script *)local_e8);
      if (bVar2) {
        ScriptUtil::CreateP2wpkhLockingScript((Script *)local_218,(Pubkey *)local_58);
        ScriptUtil::CreateP2shLockingScript(&local_250,(Script *)local_218);
        Script::operator=((Script *)local_170,&local_250);
        Script::~Script(&local_250);
        Script::operator=((Script *)
                          &script.script_stack_.
                           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)local_218);
        Script::~Script((Script *)local_218);
      }
    }
  }
  bVar2 = Script::Equals((Script *)local_e8,(Script *)local_170);
  if (!bVar2) {
    local_268.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_268.filename = local_268.filename + 1;
    local_268.line = 0xb7b;
    local_268.funcname = "SetTxOutData";
    logger::warn<>(&local_268,"unmatch pubkey.");
    local_28a = 1;
    this_01 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_288,"psbt unmatch pubkey error.",&local_289);
    CfdException::CfdException(this_01,kCfdIllegalArgumentError,&local_288);
    local_28a = 0;
    __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
  }
  GetTxOutScript(&local_2c8,this,index,true,(bool *)0x0);
  bVar2 = Script::IsEmpty(&local_2c8);
  Script::~Script(&local_2c8);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    Script::Script(&local_300);
    Script::operator=((Script *)
                      &script.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_300);
    Script::~Script(&local_300);
  }
  SetTxOutData(this,index,
               (Script *)
               &script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,key);
  Script::~Script((Script *)local_170);
  Script::~Script((Script *)
                  &script.script_stack_.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Script::~Script((Script *)local_e8);
LAB_002ed687:
  Pubkey::~Pubkey((Pubkey *)local_58);
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Psbt::SetTxOutData(uint32_t index, const KeyData &key) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  std::vector<KeyData> arr = GetTxOutKeyDataList(index);
  Pubkey pubkey = key.GetPubkey();
  for (auto &item : arr) {
    if (pubkey.Equals(item.GetPubkey())) return;
  }

  struct wally_tx_output *txout = &psbt_pointer->tx->outputs[index];
  Script locking_script(
      ByteData(txout->script, static_cast<uint32_t>(txout->script_len)));
  Script redeem_script;
  Script script;

  if (locking_script.IsP2pkhScript()) {
    script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  } else if (locking_script.IsP2wpkhScript()) {
    script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
  } else if (locking_script.IsP2shScript()) {
    auto wpkh_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
    script = ScriptUtil::CreateP2shLockingScript(wpkh_script);
    redeem_script = wpkh_script;
  }
  if (!locking_script.Equals(script)) {
    warn(CFD_LOG_SOURCE, "unmatch pubkey.");
    throw CfdException(kCfdIllegalArgumentError, "psbt unmatch pubkey error.");
  }

  if (!GetTxOutScript(index, true).IsEmpty()) redeem_script = Script();
  SetTxOutData(index, redeem_script, key);
}